

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

QString * __thiscall
QUrl::host(QString *__return_storage_ptr__,QUrl *this,ComponentFormattingOptions options)

{
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (this->d != (QUrlPrivate *)0x0) {
    QUrlPrivate::appendHost
              (this->d,__return_storage_ptr__,
               (FormattingOptions)
               options.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
               super_QFlagsStorage<QUrl::ComponentFormattingOption>.i);
    bVar3 = QString::startsWith(__return_storage_ptr__,(QChar)0x5b,CaseSensitive);
    if (bVar3) {
      QString::mid(&local_38,__return_storage_ptr__,1,(__return_storage_ptr__->d).size + -2);
      data = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar1 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_38.d.d;
      (__return_storage_ptr__->d).ptr = local_38.d.ptr;
      qVar2 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_38.d.size;
      local_38.d.d = (Data *)data;
      local_38.d.ptr = pcVar1;
      local_38.d.size = qVar2;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrl::host(ComponentFormattingOptions options) const
{
    QString result;
    if (d) {
        d->appendHost(result, options);
        if (result.startsWith(u'['))
            result = result.mid(1, result.size() - 2);
    }
    return result;
}